

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

bool __thiscall
vkt::texture::anon_unknown_3::TextureFilteringTestInstance::isSupported
          (TextureFilteringTestInstance *this)

{
  ImgDim IVar1;
  VkFormat format;
  VkFormatFeatureFlags VVar2;
  VkImageType type;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  VkFormatProperties VVar5;
  uint uStack_40;
  VkFormatProperties formatProperties;
  VkImageFormatProperties imFormatProperties;
  VkFormatFeatureFlags reqImFeatures;
  VkImageCreateFlags imCreateFlags;
  TextureFilteringTestInstance *this_local;
  
  IVar1 = (this->m_imParams).dim;
  VVar2 = getRequiredFormatFeatures(&this->m_samplerParams);
  pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  format = (this->m_imParams).format;
  type = mapImageType((this->m_imParams).dim);
  ::vk::getPhysicalDeviceImageFormatProperties
            ((VkImageFormatProperties *)&formatProperties.optimalTilingFeatures,pIVar3,pVVar4,format
             ,type,VK_IMAGE_TILING_OPTIMAL,6,(uint)(IVar1 == IMG_DIM_CUBE) << 4);
  pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  VVar5 = ::vk::getPhysicalDeviceFormatProperties(pIVar3,pVVar4,(this->m_imParams).format);
  uStack_40 = VVar5.optimalTilingFeatures;
  return (uStack_40 & VVar2) == VVar2;
}

Assistant:

bool TextureFilteringTestInstance::isSupported (void)
{
	const VkImageCreateFlags		imCreateFlags		= (m_imParams.dim == IMG_DIM_CUBE) ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0;
	const VkFormatFeatureFlags		reqImFeatures		= getRequiredFormatFeatures(m_samplerParams);

	const VkImageFormatProperties	imFormatProperties	= getPhysicalDeviceImageFormatProperties(m_context.getInstanceInterface(),
																								 m_context.getPhysicalDevice(),
																								 m_imParams.format,
																								 mapImageType(m_imParams.dim),
																								 VK_IMAGE_TILING_OPTIMAL,
																								 VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_SAMPLED_BIT,
																								 imCreateFlags);
	const VkFormatProperties		formatProperties	= getPhysicalDeviceFormatProperties(m_context.getInstanceInterface(),
																							m_context.getPhysicalDevice(),
																							m_imParams.format);

	// \todo [2016-06-23 collinbaker] Check image parameters against imFormatProperties
	DE_UNREF(imFormatProperties);

	return (formatProperties.optimalTilingFeatures & reqImFeatures) == reqImFeatures;
}